

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::CoatedConductorMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CoatedConductorMaterial *this)

{
  StringPrintf<>(__return_storage_ptr__,"[ CoatedConductorMaterial TODO ]");
  return __return_storage_ptr__;
}

Assistant:

std::string CoatedConductorMaterial::ToString() const {
    return StringPrintf("[ CoatedConductorMaterial TODO ]");
}